

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testNNCompilerValidation(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  DictionaryFeatureType *this;
  NeuralNetworkClassifier *this_00;
  StringVector *this_01;
  NeuralNetworkLayer *pNVar6;
  InnerProductLayerParams *this_02;
  WeightParams *pWVar7;
  ostream *poVar8;
  undefined1 local_128 [8];
  Result res;
  InnerProductLayerParams *innerProductParams2;
  NeuralNetworkLayer *innerProductLayer2;
  InnerProductLayerParams *innerProductParams;
  NeuralNetworkLayer *innerProductLayer;
  StringVector *labels;
  NeuralNetworkClassifier *nn;
  undefined1 local_c8 [8];
  string probsName;
  undefined1 local_a0 [8];
  string featureName;
  FeatureDescription *out3;
  FeatureDescription *out2;
  ArrayFeatureType *outshape;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar5,ArrayFeatureType_ArrayDataType_DOUBLE);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"middle");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar5,ArrayFeatureType_ArrayDataType_DOUBLE);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"features");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar4);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  featureName.field_2._8_8_ = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)featureName.field_2._8_8_,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)featureName.field_2._8_8_);
  CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)featureName.field_2._8_8_);
  this = CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar4);
  CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"features",(allocator<char> *)(probsName.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(probsName.field_2._M_local_buf + 0xf));
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar2,(string *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"probs",(allocator<char> *)((long)&nn + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&nn + 7));
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  CoreML::Specification::ModelDescription::set_predictedprobabilitiesname(pMVar2,(string *)local_c8)
  ;
  this_00 = CoreML::Specification::Model::mutable_neuralnetworkclassifier((Model *)&topIn);
  this_01 = CoreML::Specification::NeuralNetworkClassifier::mutable_stringclasslabels(this_00);
  CoreML::Specification::StringVector::add_vector(this_01,"label1");
  pNVar6 = CoreML::Specification::NeuralNetworkClassifier::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar6,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar6,"middle");
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar6);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels(this_02,1);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels(this_02,1);
  pWVar7 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_02);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
  CoreML::Specification::InnerProductLayerParams::set_hasbias(this_02,false);
  pNVar6 = CoreML::Specification::NeuralNetworkClassifier::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar6,"middle");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar6,"output");
  res.m_message.field_2._8_8_ =
       CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar6);
  CoreML::Specification::InnerProductLayerParams::set_hasbias
            ((InnerProductLayerParams *)res.m_message.field_2._8_8_,false);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels
            ((InnerProductLayerParams *)res.m_message.field_2._8_8_,1);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels
            ((InnerProductLayerParams *)res.m_message.field_2._8_8_,1);
  pWVar7 = CoreML::Specification::InnerProductLayerParams::mutable_weights
                     ((InnerProductLayerParams *)res.m_message.field_2._8_8_);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
  CoreML::validate<(MLModelType)403>((Result *)local_128,(Model *)&topIn);
  bVar1 = CoreML::Result::good((Result *)local_128);
  if (!bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x3e4);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"(res).good()");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  m1._oneof_case_[0]._0_1_ = !bVar1;
  CoreML::Result::~Result((Result *)local_128);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_a0);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testNNCompilerValidation() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    topIn->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("middle");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(1);
    out->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);


    auto *out2 = m1.mutable_description()->add_output();
    out2->set_name("features");
    out2->mutable_type()->mutable_stringtype();

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_dictionarytype();
    out3->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    std::string featureName = "features";
    m1.mutable_description()->set_predictedfeaturename(featureName);
    std::string probsName = "probs";
    m1.mutable_description()->set_predictedprobabilitiesname(probsName);


    const auto nn = m1.mutable_neuralnetworkclassifier();
    auto labels = nn->mutable_stringclasslabels();
    labels->add_vector("label1");

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("middle");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);
    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->set_hasbias(false);

    Specification::NeuralNetworkLayer *innerProductLayer2 = nn->add_layers();
    innerProductLayer2->add_input("middle");
    innerProductLayer2->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams2 = innerProductLayer2->mutable_innerproduct();
    innerProductParams2->set_hasbias(false);
    innerProductParams2->set_inputchannels(1);
    innerProductParams2->set_outputchannels(1);
    innerProductParams2->mutable_weights()->add_floatvalue(1.0);

    Result res = validate<MLModelType_neuralNetworkClassifier>(m1);
    ML_ASSERT_GOOD(res);
    return 0;

}